

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::re_search_common<_1>(uint argc)

{
  vm_globalvar_t *pvVar1;
  CRegexSearcherSimple *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  undefined4 uVar6;
  vm_val_t *pvVar7;
  int iVar8;
  vm_obj_id_t vVar9;
  ushort *puVar10;
  byte *pbVar11;
  uint uVar12;
  ushort *puVar13;
  byte *pbVar14;
  size_t bytelen;
  vm_obj_id_t vVar15;
  char *pcVar16;
  uint uVar17;
  ushort *puVar18;
  ushort *puVar19;
  ushort *entirestr;
  vm_obj_id_t vVar20;
  bool bVar21;
  int match_len;
  char buf [17];
  int local_60;
  uint local_5c;
  char local_58 [7];
  char local_51 [5];
  char local_4c [12];
  vm_val_t local_40;
  
  CVmBif::check_argc_range(argc,2,3);
  pvVar7 = sp_;
  pvVar5 = sp_ + -2;
  uVar6 = *(undefined4 *)&sp_[-2].field_0x4;
  aVar3 = sp_[-2].val;
  sp_ = sp_ + 1;
  pvVar7->typ = pvVar5->typ;
  *(undefined4 *)&pvVar7->field_0x4 = uVar6;
  pvVar7->val = aVar3;
  pvVar5 = sp_;
  uVar17 = 0;
  uVar6 = *(undefined4 *)&pvVar7[-1].field_0x4;
  aVar3 = pvVar7[-1].val;
  sp_ = sp_ + 1;
  pvVar5->typ = pvVar7[-1].typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar6;
  pvVar5->val = aVar3;
  if (2 < argc) {
    if (pvVar7[-3].typ != VM_INT) {
      err_throw(0x900);
    }
    uVar17 = pvVar7[-3].val.intval;
  }
  pvVar1 = G_bif_tads_globals_X->last_rex_str;
  uVar6 = *(undefined4 *)&pvVar7[-2].field_0x4;
  aVar3 = pvVar7[-2].val;
  (pvVar1->val).typ = pvVar7[-2].typ;
  *(undefined4 *)&(pvVar1->val).field_0x4 = uVar6;
  (pvVar1->val).val = aVar3;
  pCVar2 = G_bif_tads_globals_X->rex_searcher;
  *(undefined4 *)&pCVar2->field_0x64 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x68 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x6c = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x70 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x54 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x58 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x5c = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x60 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x44 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x48 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x4c = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x50 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x34 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x38 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x3c = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x40 = 0xffffffff;
  *(undefined4 *)&(pCVar2->super_CRegexSearcher).field_0x24 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x28 = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x2c = 0xffffffff;
  *(undefined4 *)&pCVar2->field_0x30 = 0xffffffff;
  (pCVar2->match_).start_ofs = -1;
  (pCVar2->match_).end_ofs = -1;
  if ((sp_[-1].typ == VM_OBJ) &&
     (iVar8 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                     [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                         CVmObjPattern::metaclass_reg_), iVar8 != 0)) {
    pcVar16 = (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]->ptr_).obj_ +
              (sp_[-1].val.obj & 0xfff) * 0x18;
    puVar13 = (ushort *)0x0;
    sp_ = sp_ + -1;
  }
  else {
    pcVar16 = (char *)0x0;
    puVar13 = (ushort *)CVmBif::pop_str_val();
  }
  puVar10 = (ushort *)CVmBif::pop_str_val();
  pbVar11 = (byte *)(ulong)*puVar10;
  entirestr = puVar10 + 1;
  puVar19 = entirestr;
  if ((int)uVar17 < 0) {
    iVar8 = 0;
    if (pbVar11 == (byte *)0x0) {
LAB_0025b705:
      pbVar11 = (byte *)0x0;
      goto LAB_0025b711;
    }
    puVar18 = entirestr;
    do {
      puVar18 = (ushort *)
                ((long)puVar18 +
                (ulong)((((byte)*puVar18 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*puVar18 >> 7) * 3
                       ) + 1);
      iVar8 = iVar8 + 1;
    } while (puVar18 < (ushort *)((long)entirestr + (long)pbVar11));
  }
  else {
    iVar8 = -1;
    if (uVar17 == 0) {
      if (pbVar11 == (byte *)0x0) {
        uVar17 = 0;
        goto LAB_0025b705;
      }
      iVar8 = 0;
      puVar18 = entirestr;
      do {
        puVar18 = (ushort *)
                  ((long)puVar18 +
                  (ulong)((((byte)*puVar18 >> 5 & 1) != 0) + 1 &
                         (uint)(byte)((byte)*puVar18 >> 7) * 3) + 1);
        iVar8 = iVar8 + 1;
      } while (puVar18 < (ushort *)((long)entirestr + (long)pbVar11));
    }
  }
  bVar21 = SCARRY4(uVar17,iVar8);
  uVar17 = uVar17 + iVar8;
  puVar18 = entirestr;
  uVar12 = uVar17;
  if (*puVar10 != 0 && (uVar17 != 0 && bVar21 == (int)uVar17 < 0)) {
    do {
      puVar19 = (ushort *)
                ((long)puVar18 +
                (ulong)((((byte)*puVar18 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*puVar18 >> 7) * 3
                       ) + 1);
      pbVar11 = (byte *)((long)puVar18 + ((long)pbVar11 - (long)puVar19));
      if (uVar12 < 2) break;
      puVar18 = puVar19;
      uVar12 = uVar12 - 1;
    } while (pbVar11 != (byte *)0x0);
  }
LAB_0025b711:
  if (pcVar16 == (char *)0x0) {
    iVar8 = CRegexSearcherSimple::compile_and_search_back
                      (G_bif_tads_globals_X->rex_searcher,(char *)(puVar13 + 1),(ulong)*puVar13,
                       (char *)entirestr,(char *)puVar19,(size_t)pbVar11,&local_60);
  }
  else {
    iVar8 = CRegexSearcherSimple::search_back_for_pattern
                      (G_bif_tads_globals_X->rex_searcher,
                       (re_compiled_pattern *)**(undefined8 **)(pcVar16 + 8),(char *)entirestr,
                       (char *)puVar19,(size_t)pbVar11,&local_60);
  }
  local_5c = argc;
  if (iVar8 < 0) {
    CVmBif::retval_nil();
  }
  else {
    if ((int)(uVar17 - iVar8) < 1) {
      vVar15 = 1;
    }
    else {
      puVar13 = (ushort *)((long)(int)(uVar17 - iVar8) + (long)entirestr);
      vVar15 = 1;
      do {
        entirestr = (ushort *)
                    ((long)entirestr +
                    (ulong)((((byte)*entirestr >> 5 & 1) != 0) + 1 &
                           (uint)(byte)((byte)*entirestr >> 7) * 3) + 1);
        vVar15 = vVar15 + 1;
      } while (entirestr < puVar13);
    }
    pbVar11 = (byte *)((long)puVar19 + (long)-iVar8);
    bytelen = (size_t)local_60;
    if ((long)bytelen < 1) {
      vVar20 = 0;
    }
    else {
      vVar20 = 0;
      pbVar14 = pbVar11;
      do {
        pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 & (uint)(*pbVar14 >> 7) * 3) + 1;
        vVar20 = vVar20 + 1;
      } while (pbVar14 < pbVar11 + bytelen);
    }
    vVar9 = CVmObjString::create(0,(char *)pbVar11,bytelen);
    pvVar5 = sp_;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = vVar9;
    local_58[0] = '\x03';
    local_58[1] = '\0';
    local_40.typ = VM_INT;
    local_40.val.obj = vVar15;
    vmb_put_dh(local_58 + 2,&local_40);
    local_40.typ = VM_INT;
    local_40.val.obj = vVar20;
    vmb_put_dh(local_51,&local_40);
    local_40.typ = VM_OBJ;
    local_40.val.obj = vVar9;
    vmb_put_dh(local_4c,&local_40);
    vVar15 = CVmObjList::create(0,local_58);
    CVmBif::retval_obj(vVar15);
    sp_ = sp_ + -1;
  }
  sp_ = sp_ + -(long)(int)local_5c;
  return;
}

Assistant:

inline void CVmBifTADS::re_search_common(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    vm_val_t *v1 = G_stk->get(0);
    vm_val_t *v2 = G_stk->get(1);
    vm_val_t *v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    int start_idx = (dir > 0 ? 1 : 0);
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and clear out
     *   any old group registers (since they'd point into the old string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* check to see if we have a RexPattern object or an uncompiled string */
    const char *pat_str = 0;
    CVmObjPattern *pat_obj = 0;
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to search for the pattern */
    const char *str = pop_str_val(vmg0_);
    utf8_ptr p((char *)str + VMB_LEN);
    size_t len = vmb_get_len(str);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) :
                  start_idx == 0 && dir < 0 ? (int)p.len(len) :
                  -1);

    /* skip to the starting index */
    for (int i = start_idx ; i > 0 && len != 0 ; --i, p.inc(&len)) ;

    /* search for the pattern */
    int match_idx;
    int match_len;
    if (pat_obj != 0)
    {
        /* try finding the compiled pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->search_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->search_back_for_pattern(
                 pat_obj->get_pattern(vmg0_),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }
    else
    {
        /* try finding the regular expression string pattern */
        match_idx =
            (dir > 0
             ? G_bif_tads_globals->rex_searcher->compile_and_search(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len)
             : G_bif_tads_globals->rex_searcher->compile_and_search_back(
                 pat_str + VMB_LEN, vmb_get_len(pat_str),
                 str + VMB_LEN, p.getptr(), len, &match_len));
    }

    /* check for a match */
    if (match_idx >= 0)
    {
        /* 
         *   We found a match - calculate the character index of the match
         *   offset, adjusted to a 1-base.  The character index is simply the
         *   number of characters in the part of the string up to the match
         *   index.  Note that we have to add the starting index to get the
         *   actual index in the overall string, since 'p' points to the
         *   character at the starting index.  Also note that when searching
         *   backwards, the match index is the number of characters *before*
         *   the starting point.
         */
        size_t char_idx;
        if (dir > 0)
            char_idx = p.len(match_idx) + start_idx + 1;
        else
            char_idx = utf8_ptr::s_len(
                str + VMB_LEN, start_idx - match_idx) + 1;

        /* calculate the character length of the match */
        utf8_ptr matchp(p.getptr() + dir*match_idx);
        size_t char_len = matchp.len(match_len);

        /* allocate a string containing the match */
        vm_obj_id_t match_str_obj =
            CVmObjString::create(vmg_ FALSE, matchp.getptr(), match_len);

        /* push it momentarily as protection against garbage collection */
        G_stk->push()->set_obj(match_str_obj);

        /* 
         *   set up a 3-element list to contain the return value:
         *   [match_start_index, match_length, match_string] 
         */
        char buf[VMB_LEN + VMB_DATAHOLDER * 3];
        vmb_put_len(buf, 3);
        char *dst = buf + VMB_LEN;
        put_list_int(&dst, (long)char_idx);
        put_list_int(&dst, (long)char_len);
        put_list_obj(&dst, match_str_obj);

        /* allocate and return the list */
        retval_obj(vmg_ CVmObjList::create(vmg_ FALSE, buf));

        /* we no longer need the garbage collection protection */
        G_stk->discard();
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}